

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::StartStateRowProbs::operator()
          (StartStateRowProbs *this,iterator_t *str,iterator_t *end)

{
  ParserDPOMDPFormat_Spirit *pPVar1;
  pointer pvVar2;
  pointer pdVar3;
  long lVar4;
  vector<double,_std::allocator<double>_> *__x;
  long lVar5;
  StateDistribution *p;
  E *this_00;
  ostream *poVar6;
  undefined8 *puVar7;
  string err;
  stringstream ss;
  allocator<char> local_1e9;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  char *local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  pPVar1 = this->_m_po;
  if (pPVar1->_m_lp_type == UNIFORM) {
    MADPComponentDiscreteStates::SetUniformISD
              (&(pPVar1->_m_decPOMDPDiscrete->super_MultiAgentDecisionProcessDiscrete)._m_S);
    return;
  }
  pvVar2 = (pPVar1->_m_curMatrix).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(pPVar1->_m_curMatrix).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 == 0x30) &&
     (*(pointer *)
       ((long)&pvVar2[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 8) ==
      pvVar2[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start)) {
    pdVar3 = *(pointer *)
              ((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar4 = *(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data;
    lVar5 = (**(code **)(*(long *)&(pPVar1->_m_decPOMDPDiscrete->
                                   super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))();
    if ((long)pdVar3 - lVar4 >> 3 == lVar5) {
      p = (StateDistribution *)operator_new(0x20);
      __x = (this->_m_po->_m_curMatrix).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      p->_vptr_StateDistribution = (_func_int **)&PTR__StateDistribution_0059cc60;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)(p + 1),__x);
      p->_vptr_StateDistribution = (_func_int **)&PTR__StateDistributionVector_0059cb98;
      MADPComponentDiscreteStates::SetISD
                (&(this->_m_po->_m_decPOMDPDiscrete->super_MultiAgentDecisionProcessDiscrete)._m_S,p
                );
      return;
    }
    local_1e8[0] = local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"StartStateRowProbs: _m_po->_m_curMatrix","");
    std::__cxx11::string::append((char *)local_1e8);
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"StartStateRowProbs: _m_po->_m_curMatrix[0] ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"should contain NrStates(=",0x19);
    (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                           super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess
                + 0x30))();
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") entries! (not ",0x10);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = &PTR__E_0059bd80;
    std::__cxx11::string::string<std::allocator<char>>((string *)(puVar7 + 1),local_1c8,&local_1e9);
    __cxa_throw(puVar7,&E::typeinfo,E::~E);
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "StartStateRowProbs: _m_po->_m_curMatrix should                            be a row vector!")
  ;
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void operator()(iterator_t str, iterator_t end) const            
            {
                if(_m_po->_m_lp_type == UNIFORM)
                {
                    _m_po->GetDecPOMDPDiscrete()->SetUniformISD();
                    return;
                }

                //check size - it should be a row matrix...
                if( !_m_po->IsRowMatrixLP() )        
                    throw E("StartStateRowProbs: _m_po->_m_curMatrix should \
                           be a row vector!");
                if(_m_po->_m_curMatrix[0].size() != _m_po->GetDecPOMDPDiscrete()->
                        GetNrStates())
                {
                    std::string err = "StartStateRowProbs: _m_po->_m_curMatrix";
                    err += " [0] should contain NrStates(="; 
                    std::stringstream ss;
                    ss << "StartStateRowProbs: _m_po->_m_curMatrix[0] " << 
                        "should contain NrStates(=" << _m_po->GetDecPOMDPDiscrete()->
                        GetNrStates() << ") entries! (not "<<
                        _m_po->_m_curMatrix[0].size()<<")\n";

                    throw E( ss.str().c_str() );
                }

                StateDistributionVector *isd=new StateDistributionVector(_m_po->_m_curMatrix[0]);
                _m_po->GetDecPOMDPDiscrete()->SetISD(isd);
            }